

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O3

void Gli_ManSimulateSeqPref(Gli_Man_t *p,int nPref)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  Gli_Man_t *p_00;
  long lVar13;
  Vec_Int_t *pVVar14;
  
  pVVar14 = p->vCis;
  uVar5 = p->nRegs;
  iVar8 = pVVar14->nSize;
  uVar10 = iVar8 - uVar5;
  p_00 = p;
  if (uVar10 != 0 && (int)uVar5 <= iVar8) {
    lVar13 = 0;
    do {
      if (iVar8 <= lVar13) goto LAB_0074dff0;
      piVar2 = p->pObjData;
      if (piVar2 == (int *)0x0) break;
      iVar8 = pVVar14->pArray[lVar13];
      p_00 = (Gli_Man_t *)0x0;
      uVar5 = Gia_ManRandom(0);
      piVar2[(long)iVar8 + 4] = uVar5;
      lVar13 = lVar13 + 1;
      pVVar14 = p->vCis;
      uVar5 = p->nRegs;
      iVar8 = pVVar14->nSize;
      uVar10 = iVar8 - uVar5;
    } while (lVar13 < (int)uVar10);
  }
  if (0 < (int)uVar5) {
    uVar11 = (ulong)uVar10;
    uVar12 = (ulong)uVar5;
    do {
      if (((int)uVar10 < 0) || (iVar8 <= (int)uVar11)) {
LAB_0074dff0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      p_00 = (Gli_Man_t *)p->pObjData;
      if (p_00 == (Gli_Man_t *)0x0) break;
      *(undefined4 *)((long)&p_00->vCisChanged + (long)pVVar14->pArray[uVar11] * 4) = 0;
      uVar11 = uVar11 + 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  if (0 < nPref) {
    iVar8 = 0;
    do {
      iVar7 = p->nObjData;
      if ((0 < iVar7) && (piVar2 = p->pObjData, piVar2 != (int *)0x0)) {
        uVar11 = 0;
        do {
          uVar10 = piVar2[uVar11];
          if ((uVar10 & 1) == 0) {
            uVar6 = Gli_ManSimulateSeqNode(p_00,(Gli_Obj_t *)(piVar2 + uVar11));
            ((Gli_Obj_t *)(piVar2 + uVar11))->uSimInfo = uVar6;
          }
          uVar10 = (int)uVar11 + (uVar10 >> 7) + (uVar10 >> 4 & 7) + 8;
          uVar11 = (ulong)uVar10;
        } while ((int)uVar10 < iVar7);
      }
      if (0 < (int)uVar5) {
        pVVar3 = p->vCos;
        iVar7 = pVVar3->nSize;
        uVar11 = (ulong)(iVar7 - uVar5);
        uVar12 = (ulong)uVar5;
        do {
          if (((int)uVar11 < 0) || (iVar7 <= (int)uVar11)) goto LAB_0074dff0;
          p_00 = (Gli_Man_t *)p->pObjData;
          if (p_00 == (Gli_Man_t *)0x0) break;
          p_00 = (Gli_Man_t *)((long)&p_00->vCis + (long)pVVar3->pArray[uVar11] * 4);
          *(undefined4 *)&p_00->vCisChanged =
               *(undefined4 *)((long)p_00 + (long)*(int *)((long)&p_00->vAffected + 4) * -4 + 0x10);
          uVar11 = uVar11 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      iVar7 = pVVar14->nSize;
      uVar10 = iVar7 - uVar5;
      if (uVar10 != 0 && (int)uVar5 <= iVar7) {
        lVar13 = 0;
        do {
          if (iVar7 <= lVar13) goto LAB_0074dff0;
          piVar2 = p->pObjData;
          if (piVar2 == (int *)0x0) break;
          iVar7 = pVVar14->pArray[lVar13];
          p_00 = (Gli_Man_t *)0x0;
          uVar5 = Gia_ManRandom(0);
          piVar2[(long)iVar7 + 4] = uVar5;
          lVar13 = lVar13 + 1;
          pVVar14 = p->vCis;
          uVar5 = p->nRegs;
          iVar7 = pVVar14->nSize;
          uVar10 = iVar7 - uVar5;
        } while (lVar13 < (int)uVar10);
      }
      if (0 < (int)uVar5) {
        pVVar3 = p->vCos;
        iVar1 = pVVar3->nSize;
        p_00 = (Gli_Man_t *)(ulong)(iVar1 - uVar5);
        uVar11 = (ulong)uVar10;
        uVar12 = (ulong)uVar5;
        do {
          if (((int)p_00 < 0) || (iVar1 <= (int)p_00)) goto LAB_0074dff0;
          piVar2 = p->pObjData;
          if (piVar2 == (int *)0x0) break;
          if (((int)uVar10 < 0) || (iVar7 <= (int)uVar11)) goto LAB_0074dff0;
          piVar2[(long)pVVar14->pArray[uVar11] + 4] = piVar2[(long)pVVar3->pArray[(long)p_00] + 4];
          uVar11 = uVar11 + 1;
          p_00 = (Gli_Man_t *)((long)&p_00->vCis + 1);
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != nPref);
  }
  puVar9 = p->pSimInfoPrev;
  iVar8 = pVVar14->nSize;
  if (puVar9 == (uint *)0x0) {
    puVar9 = (uint *)malloc((long)iVar8 * 4);
    p->pSimInfoPrev = puVar9;
  }
  if ((0 < iVar8) && (piVar2 = p->pObjData, piVar2 != (int *)0x0)) {
    piVar4 = pVVar14->pArray;
    lVar13 = 0;
    do {
      puVar9[lVar13] = piVar2[(long)piVar4[lVar13] + 4];
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar14->nSize);
  }
  return;
}

Assistant:

void Gli_ManSimulateSeqPref( Gli_Man_t * p, int nPref )
{
    Gli_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, f;
    // initialize simulation data
    Gli_ManForEachPi( p, pObj, i )
        pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
    Gli_ManForEachRo( p, pObj, i )
        pObj->uSimInfo = 0;
    for ( f = 0; f < nPref; f++ )
    {
        // simulate one frame
        Gli_ManForEachNode( p, pObj, i )
            pObj->uSimInfo = Gli_ManSimulateSeqNode( p, pObj );
        Gli_ManForEachRi( p, pObj, i )
            pObj->uSimInfo = Gli_ObjFanin(pObj, 0)->uSimInfo;
        // initialize the next frame
        Gli_ManForEachPi( p, pObj, i )
            pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
        Gli_ManForEachRiRo( p, pObjRi, pObjRo, i )
            pObjRo->uSimInfo = pObjRi->uSimInfo;
    }
    // save simulation data after nPref timeframes
    if ( p->pSimInfoPrev == NULL )
        p->pSimInfoPrev = ABC_ALLOC( unsigned, Gli_ManCiNum(p) );
    Gli_ManForEachCi( p, pObj, i )
        p->pSimInfoPrev[i] = pObj->uSimInfo;
}